

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::UnlockedPoolAllocator::~UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__UnlockedPoolAllocator_0017e710;
  clear(this);
  this_00 = &this->payouts;
  if ((this->payouts).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
    fwrite("FATAL ERROR! unlocked pool allocator destroyed too early\n",0x39,1,_stderr);
    p_Var1 = (_List_node_base *)this_00;
    while (p_Var1 = (((_List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                       *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var1 != (_List_node_base *)this_00) {
      fprintf(_stderr,"%p still in use\n",p_Var1[1]._M_prev);
    }
  }
  std::__cxx11::
  _List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  _M_clear(&this_00->
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          );
  std::__cxx11::
  _List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  _M_clear(&(this->budgets).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
          );
  return;
}

Assistant:

UnlockedPoolAllocator::~UnlockedPoolAllocator()
{
    clear();

    if (!payouts.empty())
    {
        fprintf(stderr, "FATAL ERROR! unlocked pool allocator destroyed too early\n");
        std::list< std::pair<size_t, void*> >::iterator it = payouts.begin();
        for (; it != payouts.end(); it++)
        {
            void* ptr = it->second;
            fprintf(stderr, "%p still in use\n", ptr);
        }
    }
}